

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

bool __thiscall
HEkk::reinvertOnNumericalTrouble
          (HEkk *this,string *method_name,double *numerical_trouble_measure,double alpha_from_col,
          double alpha_from_row,double numerical_trouble_tolerance)

{
  int iVar1;
  pointer pcVar2;
  bool reinvert;
  double dVar3;
  double dVar4;
  double dVar5;
  string local_50;
  
  dVar4 = ABS(alpha_from_col);
  dVar3 = ABS(alpha_from_row);
  dVar5 = dVar3;
  if (dVar4 <= dVar3) {
    dVar5 = dVar4;
  }
  dVar5 = ABS(dVar4 - dVar3) / dVar5;
  *numerical_trouble_measure = dVar5;
  iVar1 = (this->info_).update_count;
  reinvert = 0 < iVar1 && numerical_trouble_tolerance < dVar5;
  pcVar2 = (method_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + method_name->_M_string_length);
  debugReportReinvertOnNumericalTrouble
            (this,&local_50,*numerical_trouble_measure,alpha_from_col,alpha_from_row,
             numerical_trouble_tolerance,reinvert);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (0 < iVar1 && numerical_trouble_tolerance < dVar5) {
    dVar5 = (this->info_).factor_pivot_threshold;
    if (0.1 <= dVar5) {
      dVar3 = 0.0;
      if ((iVar1 < 10 && dVar5 < 0.5) && (dVar3 = 0.5, dVar5 * 5.0 <= 0.5)) {
        dVar3 = dVar5 * 5.0;
      }
    }
    else {
      dVar3 = 0.1;
      if (dVar5 * 5.0 <= 0.1) {
        dVar3 = dVar5 * 5.0;
      }
    }
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kWarning,
                   "   Increasing Markowitz threshold to %g\n");
      (this->info_).factor_pivot_threshold = dVar3;
      HSimplexNla::setPivotThreshold(&this->simplex_nla_,dVar3);
    }
  }
  return reinvert;
}

Assistant:

bool HEkk::reinvertOnNumericalTrouble(
    const std::string method_name, double& numerical_trouble_measure,
    const double alpha_from_col, const double alpha_from_row,
    const double numerical_trouble_tolerance) {
  double abs_alpha_from_col = fabs(alpha_from_col);
  double abs_alpha_from_row = fabs(alpha_from_row);
  double min_abs_alpha = min(abs_alpha_from_col, abs_alpha_from_row);
  double abs_alpha_diff = fabs(abs_alpha_from_col - abs_alpha_from_row);
  numerical_trouble_measure = abs_alpha_diff / min_abs_alpha;
  const HighsInt update_count = info_.update_count;
  // Reinvert if the relative difference is large enough, and updates have been
  // performed
  const bool numerical_trouble =
      numerical_trouble_measure > numerical_trouble_tolerance;
  const bool reinvert = numerical_trouble && update_count > 0;
  debugReportReinvertOnNumericalTrouble(method_name, numerical_trouble_measure,
                                        alpha_from_col, alpha_from_row,
                                        numerical_trouble_tolerance, reinvert);
  if (reinvert) {
    // Consider increasing the Markowitz multiplier
    const double current_pivot_threshold = info_.factor_pivot_threshold;
    double new_pivot_threshold = 0;
    if (current_pivot_threshold < kDefaultPivotThreshold) {
      // Threshold is below default value, so increase it
      new_pivot_threshold =
          min(current_pivot_threshold * kPivotThresholdChangeFactor,
              kDefaultPivotThreshold);
    } else if (current_pivot_threshold < kMaxPivotThreshold) {
      // Threshold is below max value, so increase it if few updates have been
      // performed
      if (update_count < 10)
        new_pivot_threshold =
            min(current_pivot_threshold * kPivotThresholdChangeFactor,
                kMaxPivotThreshold);
    }
    if (new_pivot_threshold) {
      highsLogUser(options_->log_options, HighsLogType::kWarning,
                   "   Increasing Markowitz threshold to %g\n",
                   new_pivot_threshold);
      info_.factor_pivot_threshold = new_pivot_threshold;
      simplex_nla_.setPivotThreshold(new_pivot_threshold);
    }
  }
  return reinvert;
}